

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::throwLogicError(string *message,SourceLineInfo *locationInfo)

{
  bool bVar1;
  ostream *poVar2;
  logic_error *this;
  string *in_RDI;
  ostringstream oss;
  SourceLineInfo *in_stack_fffffffffffffe08;
  ostream *in_stack_fffffffffffffe10;
  string local_1b8 [48];
  ostringstream local_188 [384];
  string *local_8;
  
  local_8 = in_RDI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar2 = operator<<(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  poVar2 = std::operator<<(poVar2,": Internal Catch error: \'");
  poVar2 = std::operator<<(poVar2,local_8);
  std::operator<<(poVar2,"\'");
  bVar1 = alwaysTrue();
  if (!bVar1) {
    std::__cxx11::ostringstream::~ostringstream(local_188);
    return;
  }
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::logic_error::logic_error(this,local_1b8);
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void throwLogicError( std::string const& message, SourceLineInfo const& locationInfo ) {
        std::ostringstream oss;
        oss << locationInfo << ": Internal Catch error: '" << message << "'";
        if( alwaysTrue() )
            throw std::logic_error( oss.str() );
    }